

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::UntypedMapBase::UntypedSwap(UntypedMapBase *this,UntypedMapBase *other)

{
  Arena *__tmp;
  UntypedMapBase tmp;
  UntypedMapBase local_38;
  
  local_38.arena_ = this->arena_;
  if (local_38.arena_ != other->arena_) {
    local_38.type_info_ = this->type_info_;
    local_38.num_elements_ = this->num_elements_;
    this->num_elements_ = 0;
    local_38.num_buckets_ = this->num_buckets_;
    this->num_buckets_ = 1;
    local_38.index_of_first_non_null_ = this->index_of_first_non_null_;
    this->index_of_first_non_null_ = 1;
    local_38.table_ = this->table_;
    this->table_ = (NodeBase **)&kGlobalEmptyTable;
    UntypedMergeFrom(this,other);
    if (other->num_buckets_ != 1) {
      ClearTableImpl(other,true);
    }
    UntypedMergeFrom(other,&local_38);
    if ((this->arena_ == (Arena *)0x0) && (local_38.num_buckets_ != 1)) {
      ClearTableImpl(&local_38,false);
    }
    return;
  }
  InternalSwap(this,other);
  return;
}

Assistant:

void UntypedMapBase::UntypedSwap(UntypedMapBase& other) {
  if (arena() == other.arena()) {
    InternalSwap(&other);
  } else {
    UntypedMapBase tmp(arena_, type_info_);
    InternalSwap(&tmp);

    ABSL_DCHECK(empty());
    UntypedMergeFrom(other);

    other.ClearTable(true);
    other.UntypedMergeFrom(tmp);

    if (arena_ == nullptr) tmp.ClearTable(false);
  }
}